

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

pattern * makeNode(pattern *lhs,pattern *rhs,int type)

{
  pattern *ppVar1;
  
  ppVar1 = (pattern *)malloc(0x28);
  if (ppVar1 == (pattern *)0x0) {
    halt("out of memory in makeNode()");
  }
  else {
    ppVar1->lhs = lhs;
    ppVar1->rhs = rhs;
    ppVar1->type = type;
    ppVar1->val = 0;
    ppVar1->fvec[0] = 0.0;
    ppVar1->fvec[1] = 0.0;
    ppVar1->fvec[2] = 0.0;
    ppVar1->fvec[3] = 0.0;
  }
  return ppVar1;
}

Assistant:

pattern* makeNode(pattern *lhs, pattern *rhs, int type) {
   pattern *node;
   node = (pattern *)malloc(sizeof(pattern));
   if (node) {
      node->lhs = lhs;
      node->rhs = rhs;
      node->type = type;
      node->val  = 0;
      node->fvec[0] = 0.0;
      node->fvec[1] = 0.0;
      node->fvec[2] = 0.0;
      node->fvec[3] = 0.0;
   }
   else {
      halt("out of memory in makeNode()");
   }
   return node;
}